

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateSurfaceTests.cpp
# Opt level: O0

EGLSurface
deqp::egl::anon_unknown_5::createPixmapSurface
          (EGLDisplay display,EGLConfig config,NativeDisplay *nativeDisplay,NativePixmap *pixmap,
          bool useLegacyCreate)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined8 uVar3;
  undefined4 extraout_var_00;
  char *platformExt;
  undefined4 extraout_var_01;
  EGLSurface local_40;
  EGLSurface surface;
  Library *egl;
  bool useLegacyCreate_local;
  NativePixmap *pixmap_local;
  NativeDisplay *nativeDisplay_local;
  EGLConfig config_local;
  EGLDisplay display_local;
  Library *egl_00;
  
  iVar1 = (*nativeDisplay->_vptr_NativeDisplay[2])();
  egl_00 = (Library *)CONCAT44(extraout_var,iVar1);
  if (useLegacyCreate) {
    uVar3 = (**(code **)(*(long *)pixmap + 0x10))();
    iVar1 = (*egl_00->_vptr_Library[0xb])(egl_00,display,config,uVar3,0);
    local_40 = (EGLSurface)CONCAT44(extraout_var_00,iVar1);
    dVar2 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar2,"eglCreatePixmapSurface() failed",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                     ,0x5e);
  }
  else {
    platformExt = eglu::NativeDisplay::getPlatformExtensionName(nativeDisplay);
    checkEGLPlatformSupport(egl_00,platformExt);
    uVar3 = (**(code **)(*(long *)pixmap + 0x18))();
    iVar1 = (*egl_00->_vptr_Library[0xd])(egl_00,display,config,uVar3,0);
    local_40 = (EGLSurface)CONCAT44(extraout_var_01,iVar1);
    dVar2 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar2,"eglCreatePlatformPixmapSurfaceEXT() failed",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                     ,0x65);
  }
  return local_40;
}

Assistant:

EGLSurface createPixmapSurface (EGLDisplay display, EGLConfig config, eglu::NativeDisplay& nativeDisplay, eglu::NativePixmap& pixmap, bool useLegacyCreate)
{
	const Library&	egl		= nativeDisplay.getLibrary();
	EGLSurface		surface	= EGL_NO_SURFACE;

	if (useLegacyCreate)
	{
		surface = egl.createPixmapSurface(display, config, pixmap.getLegacyNative(), DE_NULL);
		EGLU_CHECK_MSG(egl, "eglCreatePixmapSurface() failed");
	}
	else
	{
		checkEGLPlatformSupport(egl, nativeDisplay.getPlatformExtensionName());

		surface = egl.createPlatformPixmapSurfaceEXT(display, config, pixmap.getPlatformNative(), DE_NULL);
		EGLU_CHECK_MSG(egl, "eglCreatePlatformPixmapSurfaceEXT() failed");
	}

	return surface;
}